

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O2

vec3f __thiscall Triangle::Ns(Triangle *this,point *p)

{
  vec3f *b;
  vec3f *b_00;
  float fVar1;
  float fVar2;
  vec3f vVar3;
  vec3f vVar4;
  vec3f vVar5;
  float local_b8;
  float fStack_b4;
  float local_a8;
  float fStack_a4;
  float local_98;
  float fStack_94;
  vec3f local_88;
  vec3f local_78;
  vec3f local_68;
  vec3f local_58;
  vec3f local_48;
  vec3f local_38;
  
  b = &this->vn1;
  vVar3 = operator-(&this->vn3,b);
  b_00 = &this->v1;
  vVar4 = operator-(p,b_00);
  local_58.z = vVar4.z;
  local_58._0_8_ = vVar4._0_8_;
  vVar4 = operator-(&this->v2,b_00);
  local_68.z = vVar4.z;
  local_68._0_8_ = vVar4._0_8_;
  vVar4 = cross(&local_58,&local_68);
  fVar2 = SQRT(vVar4.z * vVar4.z + vVar4.x * vVar4.x + vVar4.y * vVar4.y);
  fVar1 = this->one_by_2S;
  local_a8 = vVar3.x;
  fStack_a4 = vVar3.y;
  local_48.z = vVar3.z * fVar2 * fVar1;
  local_48.y = fVar1 * fVar2 * fStack_a4;
  local_48.x = fVar1 * fVar2 * local_a8;
  vVar3 = operator+(b,&local_48);
  vVar4 = operator-(&this->vn2,b);
  vVar5 = operator-(p,b_00);
  local_78.z = vVar5.z;
  local_78._0_8_ = vVar5._0_8_;
  vVar5 = operator-(&this->v3,b_00);
  local_88.z = vVar5.z;
  local_88._0_8_ = vVar5._0_8_;
  vVar5 = cross(&local_78,&local_88);
  fVar2 = SQRT(vVar5.z * vVar5.z + vVar5.x * vVar5.x + vVar5.y * vVar5.y);
  fVar1 = this->one_by_2S;
  local_98 = vVar4.x;
  fStack_94 = vVar4.y;
  local_b8 = vVar3.x;
  fStack_b4 = vVar3.y;
  local_38.z = vVar4.z * fVar2 * fVar1 + vVar3.z;
  local_38.y = fVar1 * fVar2 * fStack_94 + fStack_b4;
  local_38.x = fVar1 * fVar2 * local_98 + local_b8;
  vVar3 = normalized(&local_38);
  return vVar3;
}

Assistant:

vec3f Ns(const point& p) const
	{
		assert(onsurface(p));
		return normalized(
			vn1 + (vn3-vn1) * norm(cross(p-v1, v2-v1)) * one_by_2S
				+ (vn2-vn1) * norm(cross(p-v1, v3-v1)) * one_by_2S); // TO OPTIMIZE
	}